

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_renderer.c
# Opt level: O0

void GPU_GetActiveRendererList(GPU_RendererID *renderers_array)

{
  GPU_Renderer *pGVar1;
  int iVar2;
  undefined4 uVar3;
  GPU_RendererID *pGVar4;
  int local_18;
  int local_14;
  int i;
  int count;
  GPU_RendererID *renderers_array_local;
  
  gpu_init_renderer_register();
  local_14 = 0;
  for (local_18 = 0; local_18 < 0x14; local_18 = local_18 + 1) {
    if (_gpu_renderer_map[local_18] != (GPU_Renderer *)0x0) {
      pGVar4 = renderers_array + local_14;
      pGVar1 = _gpu_renderer_map[local_18];
      pGVar4->name = (pGVar1->id).name;
      iVar2 = (pGVar1->id).major_version;
      pGVar4->renderer = (pGVar1->id).renderer;
      pGVar4->major_version = iVar2;
      uVar3 = *(undefined4 *)&(pGVar1->id).field_0x14;
      pGVar4->minor_version = (pGVar1->id).minor_version;
      *(undefined4 *)&pGVar4->field_0x14 = uVar3;
      local_14 = local_14 + 1;
    }
  }
  return;
}

Assistant:

void GPU_GetActiveRendererList(GPU_RendererID* renderers_array)
{
	int count;
	int i;

	gpu_init_renderer_register();

	count = 0;
	for(i = 0; i < GPU_MAX_ACTIVE_RENDERERS; i++)
	{
		if(_gpu_renderer_map[i] != NULL)
		{
			renderers_array[count] = _gpu_renderer_map[i]->id;
			count++;
		}
	}
}